

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_scale_impl(ggml_context *ctx,ggml_tensor *a,float s,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  float s_local;
  
  s_local = s;
  _Var1 = ggml_is_padded_1d(a);
  if (_Var1) {
    if (inplace) {
      tensor = ggml_view_tensor(ctx,a);
    }
    else {
      tensor = ggml_dup_tensor(ctx,a);
    }
    ggml_set_op_params(tensor,&s_local,4);
    tensor->op = GGML_OP_SCALE;
    tensor->src[0] = a;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xb19,
             "GGML_ASSERT(%s) failed","ggml_is_padded_1d(a)");
}

Assistant:

static struct ggml_tensor * ggml_scale_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 s,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_padded_1d(a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &s, sizeof(s));

    result->op     = GGML_OP_SCALE;
    result->src[0] = a;

    return result;
}